

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
cnn::LookupParameters::Initialize
          (LookupParameters *this,uint index,vector<float,_std::allocator<float>_> *val)

{
  pointer __src;
  size_t __n;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  __src = (val->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_start;
  __n = (long)(val->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)__src;
  uVar2 = (ulong)(this->dim).nd;
  iVar1 = 1;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      iVar1 = iVar1 * (this->dim).d[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  if (iVar1 * (this->dim).bd == (int)(__n >> 2)) {
    memcpy((this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start[index].v,__src,__n);
    return;
  }
  __assert_fail("int(val.size()) == int(dim.size())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/model.cc"
                ,0x61,"void cnn::LookupParameters::Initialize(unsigned int, const vector<float> &)")
  ;
}

Assistant:

void LookupParameters::Initialize(unsigned index, const vector<float>& val) {
  assert(int(val.size()) == int(dim.size()));
#if HAVE_CUDA
  cerr << "implement LookupParameters::Initialize\n";
  throw cuda_not_implemented("LookupParameters::Initialize");
#else
  memcpy(values[index].v, &val[0], val.size() * sizeof(float));
#endif
}